

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_queue.c
# Opt level: O3

void message_queue_destroy(MESSAGE_QUEUE_HANDLE message_queue)

{
  if (message_queue != (MESSAGE_QUEUE_HANDLE)0x0) {
    message_queue_remove_all(message_queue);
    if (message_queue->pending != (SINGLYLINKEDLIST_HANDLE)0x0) {
      singlylinkedlist_destroy(message_queue->pending);
    }
    if (message_queue->in_progress != (SINGLYLINKEDLIST_HANDLE)0x0) {
      singlylinkedlist_destroy(message_queue->in_progress);
    }
    free(message_queue);
    return;
  }
  return;
}

Assistant:

void message_queue_destroy(MESSAGE_QUEUE_HANDLE message_queue)
{
    if (message_queue != NULL)
    {
        message_queue_remove_all(message_queue);

        if (message_queue->pending != NULL)
        {
            singlylinkedlist_destroy(message_queue->pending);
        }

        if (message_queue->in_progress != NULL)
        {
            singlylinkedlist_destroy(message_queue->in_progress);
        }

        free(message_queue);
    }
}